

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntru.c
# Opt level: O0

ecdh_key * ssh_ntru_server_new(void)

{
  undefined8 *puVar1;
  void *pvVar2;
  strbuf *psVar3;
  ecdh_key *peVar4;
  ntru_server_key *nk;
  
  puVar1 = (undefined8 *)safemalloc(1,0x28,0);
  puVar1[4] = &ssh_ntru_server_vt;
  pvVar2 = safemalloc(0x2f9,2,0);
  *puVar1 = pvVar2;
  psVar3 = strbuf_new_nm();
  puVar1[1] = psVar3;
  psVar3 = strbuf_new_nm();
  puVar1[2] = psVar3;
  ntru_gen_short((uint16_t *)*puVar1,0x2f9,0x11e);
  peVar4 = ecdh_key_new(&ssh_ec_kex_curve25519,false);
  puVar1[3] = peVar4;
  return (ecdh_key *)(puVar1 + 4);
}

Assistant:

static ecdh_key *ssh_ntru_server_new(void)
{
    ntru_server_key *nk = snew(ntru_server_key);
    nk->ek.vt = &ssh_ntru_server_vt;

    nk->plaintext = snewn(p_LIVE, uint16_t);
    nk->ciphertext_encoded = strbuf_new_nm();
    nk->confirmation_hash = strbuf_new_nm();
    ntru_gen_short(nk->plaintext, p_LIVE, w_LIVE);

    nk->curve25519 = ecdh_key_new(&ssh_ec_kex_curve25519, false);

    return &nk->ek;
}